

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O0

ExpressionValue *
expFuncOutputName(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
                 vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  string local_a0;
  StringLiteral local_80;
  undefined1 local_60 [8];
  string value;
  undefined1 local_30 [8];
  shared_ptr<AssemblerFile> file;
  vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters_local;
  Identifier *funcName_local;
  
  file.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)parameters;
  FileManager::getOpenFile((FileManager *)local_30);
  bVar1 = std::operator==((shared_ptr<AssemblerFile> *)local_30,(nullptr_t)0x0);
  if (bVar1) {
    Logger::queueError<>(Error,"outputName: no file opened");
    ExpressionValue::ExpressionValue(__return_storage_ptr__);
    value.field_2._8_4_ = 1;
  }
  else {
    peVar3 = std::__shared_ptr_access<AssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<AssemblerFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    iVar2 = (*peVar3->_vptr_AssemblerFile[0xf])();
    ghc::filesystem::path::u8string_abi_cxx11_
              ((string *)local_60,(path *)CONCAT44(extraout_var,iVar2));
    std::__cxx11::string::string((string *)&local_a0,(string *)local_60);
    StringLiteral::StringLiteral(&local_80,&local_a0);
    ExpressionValue::ExpressionValue(__return_storage_ptr__,&local_80);
    StringLiteral::~StringLiteral(&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    value.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)local_60);
  }
  std::shared_ptr<AssemblerFile>::~shared_ptr((shared_ptr<AssemblerFile> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncOutputName(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	std::shared_ptr<AssemblerFile> file = g_fileManager->getOpenFile();
	if (file == nullptr)
	{
		Logger::queueError(Logger::Error, "outputName: no file opened");
		return ExpressionValue();
	}

	std::string value = file->getFileName().u8string();
	return ExpressionValue(value);
}